

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O3

char * __thiscall QTreeModel::index(QTreeModel *this,char *__s,int __c)

{
  long *plVar1;
  int iVar2;
  SortOrder SVar3;
  QTreeView *pQVar4;
  QHeaderView *pQVar5;
  undefined4 in_ECX;
  ulong uVar6;
  undefined4 in_register_00000014;
  long lVar7;
  long lVar8;
  ulong uVar9;
  
  lVar7 = CONCAT44(in_register_00000014,__c);
  if (((__s[0x54] == '\0') && (*(int *)(__s + 0x50) != 0)) &&
     (*(long *)(*(long *)(__s + 8) + 0x88) == 0)) {
    QBasicTimer::stop();
    pQVar4 = (QTreeView *)QMetaObject::cast((QObject *)&QTreeWidget::staticMetaObject);
    pQVar5 = QTreeView::header(pQVar4);
    iVar2 = QHeaderView::sortIndicatorSection(pQVar5);
    pQVar4 = (QTreeView *)QMetaObject::cast((QObject *)&QTreeWidget::staticMetaObject);
    pQVar5 = QTreeView::header(pQVar4);
    SVar3 = QHeaderView::sortIndicatorOrder(pQVar5);
    (**(code **)(*(long *)__s + 0x140))(__s,iVar2,SVar3);
  }
  if ((lVar7 == 0) || (*(long *)(__s + 0x10) == lVar7)) {
    *(undefined8 *)this = 0xffffffffffffffff;
    *(undefined8 *)&this->field_0x8 = 0;
    this->rootItem = (QTreeWidgetItem *)0x0;
    return (char *)this;
  }
  lVar8 = *(long *)(__s + 0x10);
  if (*(long *)(lVar7 + 0x38) != 0) {
    lVar8 = *(long *)(lVar7 + 0x38);
  }
  iVar2 = *(int *)(*(long *)(lVar7 + 0x30) + 0x24);
  uVar6 = (ulong)iVar2;
  uVar9 = *(ulong *)(lVar8 + 0x50);
  if (((long)uVar6 < 0) || (uVar9 <= uVar6)) {
    if (0 < (long)uVar9) goto LAB_005acbf3;
LAB_005acc14:
    iVar2 = -1;
  }
  else {
    if (*(long *)(*(long *)(lVar8 + 0x48) + uVar6 * 8) == lVar7) goto LAB_005acc1c;
LAB_005acbf3:
    uVar9 = uVar9 << 3;
    do {
      if (uVar9 == 0) goto LAB_005acc14;
      uVar6 = uVar9 - 8;
      plVar1 = (long *)(*(long *)(lVar8 + 0x48) + -8 + uVar9);
      uVar9 = uVar6;
    } while (*plVar1 != lVar7);
    iVar2 = (int)(uVar6 >> 3);
  }
  *(int *)(*(long *)(lVar7 + 0x30) + 0x24) = iVar2;
LAB_005acc1c:
  *(int *)this = iVar2;
  *(undefined4 *)&this->field_0x4 = in_ECX;
  *(long *)&this->field_0x8 = lVar7;
  this->rootItem = (QTreeWidgetItem *)__s;
  return (char *)this;
}

Assistant:

QModelIndex QTreeModel::index(const QTreeWidgetItem *item, int column) const
{
    executePendingSort();

    if (!item || (item == rootItem))
        return QModelIndex();
    const QTreeWidgetItem *par = item->parent();
    QTreeWidgetItem *itm = const_cast<QTreeWidgetItem*>(item);
    if (!par)
        par = rootItem;
    int row;
    int guess = item->d->rowGuess;
    if (guess >= 0
        && par->children.size() > guess
        && par->children.at(guess) == itm) {
        row = guess;
    } else {
        row = par->children.lastIndexOf(itm);
        itm->d->rowGuess = row;
    }
    return createIndex(row, column, itm);
}